

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::iterate(DrawCallBatchingTest *this)

{
  bool bVar1;
  TestLog *log;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *log_00;
  TestContext *this_00;
  ulong uVar2;
  long *plVar3;
  pointer puVar4;
  double *pdVar5;
  long *plVar6;
  pointer puVar7;
  int iVar8;
  int precision;
  pointer puVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  int iVar10;
  char *pcVar11;
  bool *pbVar12;
  ulong uVar13;
  pointer puVar14;
  iterator __position;
  ulong uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ScopedLogSection section;
  Statistics unbatchedStats;
  ScopedLogSection section_1;
  allocator<char> local_299;
  double *local_298;
  double local_290;
  pointer local_288;
  double local_280;
  Statistics local_278;
  long lStack_260;
  string local_258;
  double local_238;
  ScopedLogSection local_230;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  double local_208;
  undefined1 local_200 [8];
  _func_int **local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0 [6];
  ios_base local_190 [8];
  ios_base local_188 [264];
  long *local_80 [2];
  long local_70 [2];
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  switch(this->m_state) {
  case STATE_LOG_INFO:
    log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    local_1f0[0]._M_allocated_capacity = 0x666e692074736554;
    local_1f0[0]._8_2_ = 0x6f;
    local_1f8 = (_func_int **)0x9;
    local_258.field_2._M_allocated_capacity = 0x666e692074736554;
    local_258.field_2._8_2_ = 0x6f;
    local_258._M_string_length = 9;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_200 = (undefined1  [8])local_1f0;
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&local_278,log,(string *)local_200,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if (local_200 != (undefined1  [8])local_1f0) {
      operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
    }
    local_200 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"Rendering using ",0x10);
    bVar1 = (this->m_spec).useDrawElements;
    pcVar11 = "glDrawArrays()";
    if (bVar1 != false) {
      pcVar11 = "glDrawElements()";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,pcVar11,(ulong)bVar1 * 2 + 0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
    if ((this->m_spec).useDrawElements == true) {
      local_200 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,"Using ",6);
      bVar1 = (this->m_spec).dynamicIndices;
      pcVar11 = glcts::fixed_sample_locations_values + 1;
      if (bVar1 != false) {
        pcVar11 = "dynamic ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,pcVar11,(ulong)bVar1 << 3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,"indices from ",0xd);
      uVar13 = (ulong)(this->m_spec).useIndexBuffer;
      pcVar11 = "pointer";
      if (uVar13 != 0) {
        pcVar11 = "buffer";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,pcVar11,uVar13 ^ 7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,".",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
    }
    if (0 < (this->m_spec).staticAttributeCount) {
      local_200 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,"Using ",6);
      std::ostream::operator<<((ostringstream *)&local_1f8,(this->m_spec).staticAttributeCount);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8," static attribute",0x11);
      iVar8 = (this->m_spec).staticAttributeCount;
      pbVar12 = glcts::fixed_sample_locations_values + 1;
      if (1 < iVar8) {
        pbVar12 = (bool *)0x1c21c7b;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,pbVar12,(ulong)(1 < iVar8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8," from ",6);
      uVar13 = (ulong)(this->m_spec).useStaticBuffer;
      pcVar11 = "pointer";
      if (uVar13 != 0) {
        pcVar11 = "buffer";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,pcVar11,uVar13 ^ 7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,".",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
    }
    if (0 < (this->m_spec).dynamicAttributeCount) {
      local_200 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,"Using ",6);
      std::ostream::operator<<((ostringstream *)&local_1f8,(this->m_spec).dynamicAttributeCount);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8," dynamic attribute",0x12);
      iVar8 = (this->m_spec).dynamicAttributeCount;
      pbVar12 = glcts::fixed_sample_locations_values + 1;
      if (1 < iVar8) {
        pbVar12 = (bool *)0x1c21c7b;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,pbVar12,(ulong)(1 < iVar8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8," from ",6);
      uVar13 = (ulong)(this->m_spec).useDynamicBuffer;
      pcVar11 = "pointer";
      if (uVar13 != 0) {
        pcVar11 = "buffer";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,pcVar11,uVar13 ^ 7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,".",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
    }
    local_200 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,"Rendering ",10);
    std::ostream::operator<<((ostringstream *)&local_1f8,(this->m_spec).drawCallCount);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8," draw calls with ",0x11);
    std::ostream::operator<<((ostringstream *)&local_1f8,(this->m_spec).triangleCount);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8," triangles per call.",0x14);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
    tcu::TestLog::endSection((TestLog *)local_278.mean);
    this->m_state = STATE_WARMUP_BATCHED;
    break;
  case STATE_WARMUP_BATCHED:
    renderBatched(this);
    this->m_state = STATE_WARMUP_UNBATCHED;
    break;
  case STATE_WARMUP_UNBATCHED:
    renderUnbatched(this);
    this->m_state = STATE_SAMPLE;
    break;
  case STATE_CALC_CALIBRATION:
    log_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<((ostringstream *)local_200,this->m_sampleIteration);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x1bdd2e9);
    pdVar5 = (double *)(plVar3 + 2);
    if ((double *)*plVar3 == pdVar5) {
      local_278.standardErrorOfMean = *pdVar5;
      lStack_260 = plVar3[3];
      local_278.mean = (double)&local_278.standardErrorOfMean;
    }
    else {
      local_278.standardErrorOfMean = *pdVar5;
      local_278.mean = (double)*plVar3;
    }
    local_278.standardDeviation = (double)plVar3[1];
    *plVar3 = (long)pdVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,(char *)local_278.mean,&local_299);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,this->m_sampleIteration);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_80,0,(char *)0x0,0x1bdd2e9);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_218 = *plVar6;
      lStack_210 = plVar3[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *plVar6;
      local_228 = (long *)*plVar3;
    }
    local_220 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,(char *)local_228,(allocator<char> *)local_200);
    tcu::ScopedLogSection::ScopedLogSection
              (&local_230,(TestLog *)&log_00->_M_allocated_capacity,&local_258,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((double *)local_278.mean != &local_278.standardErrorOfMean) {
      operator_delete((void *)local_278.mean,(long)local_278.standardErrorOfMean + 1);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    calculateStats((Statistics *)&local_258,&this->m_unbatchedSamplesUs);
    calculateStats(&local_278,&this->m_batchedSamplesUs);
    local_200 = (undefined1  [8])log_00;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"Batched samples; Count: ",0x18);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,", Mean: ",8);
    local_298 = (double *)local_278.mean;
    std::ostream::_M_insert<double>(local_278.mean);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"us, Standard deviation: ",0x18);
    local_238 = local_278.standardDeviation;
    std::ostream::_M_insert<double>(local_278.standardDeviation);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"us, Standard error of mean: ",0x1c);
    local_290 = local_278.standardErrorOfMean;
    std::ostream::_M_insert<double>(local_278.standardErrorOfMean);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,"us(",3);
    local_290 = local_290 / (double)local_298;
    std::ostream::_M_insert<double>(local_290);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
    local_200 = (undefined1  [8])log_00;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"Unbatched samples; Count: ",0x1a);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,", Mean: ",8);
    local_288 = local_258._M_dataplus._M_p;
    std::ostream::_M_insert<double>((double)local_258._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"us, Standard deviation: ",0x18);
    local_208 = (double)local_258._M_string_length;
    std::ostream::_M_insert<double>((double)local_258._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"us, Standard error of mean: ",0x1c);
    local_280 = (double)local_258.field_2._M_allocated_capacity;
    std::ostream::_M_insert<double>((double)local_258.field_2._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,"us(",3);
    local_280 = local_280 / (double)local_288;
    std::ostream::_M_insert<double>(local_280);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
    if (this->m_sampleIteration < 3) {
      if (local_290 + local_280 <= 0.05 && 0 < this->m_sampleIteration) goto LAB_0100dad2;
      if (0.02 < local_280) {
        local_200 = (undefined1  [8])log_00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f8,"Unbatched standard error of mean outside of range.",0x32);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
        std::ios_base::~ios_base(local_188);
      }
      if (0.02 < local_290) {
        local_200 = (undefined1  [8])log_00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1f8,"Batched standard error of mean outside of range.",0x30);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
        std::ios_base::~ios_base(local_188);
      }
      if (local_208 <= 0.0) {
        puVar4 = (this->m_unbatchedSamplesUs).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar7 = (this->m_unbatchedSamplesUs).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar8 = (int)((ulong)((long)puVar7 - (long)puVar4) >> 3);
      }
      else {
        dVar16 = (local_208 / (double)local_288) / 0.02;
        puVar4 = (this->m_unbatchedSamplesUs).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar7 = (this->m_unbatchedSamplesUs).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar8 = (int)(dVar16 * dVar16);
        iVar10 = (int)((ulong)((long)puVar7 - (long)puVar4) >> 3);
        if (iVar8 < iVar10) {
          iVar8 = iVar10;
        }
      }
      this->m_unbatchedSampleCount = iVar8;
      if (local_238 <= 0.0) {
        puVar9 = (this->m_batchedSamplesUs).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar14 = (this->m_batchedSamplesUs).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        iVar8 = (int)((ulong)((long)puVar14 - (long)puVar9) >> 3);
      }
      else {
        dVar16 = (local_238 / (double)local_298) / 0.02;
        puVar9 = (this->m_batchedSamplesUs).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar14 = (this->m_batchedSamplesUs).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        iVar8 = (int)(dVar16 * dVar16);
        iVar10 = (int)((ulong)((long)puVar14 - (long)puVar9) >> 3);
        if (iVar8 < iVar10) {
          iVar8 = iVar10;
        }
      }
      this->m_batchedSampleCount = iVar8;
      if (puVar14 != puVar9) {
        (this->m_batchedSamplesUs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar9;
      }
      if (puVar7 != puVar4) {
        (this->m_unbatchedSamplesUs).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar4;
      }
      this->m_sampleIteration = this->m_sampleIteration + 1;
      this->m_state = STATE_SAMPLE;
      bVar1 = true;
    }
    else {
      local_200 = (undefined1  [8])log_00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,"Maximum iteration count reached.",0x20);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
LAB_0100dad2:
      local_200 = (undefined1  [8])log_00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,"Standard errors in target range.",0x20);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
      local_200 = (undefined1  [8])log_00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,"Batched/Unbatched ratio: ",0x19);
      local_298 = (double *)((double)local_298 / (double)local_288);
      std::ostream::_M_insert<double>((double)local_298);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
      this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
      de::floatToString_abi_cxx11_
                ((string *)local_200,(de *)&DAT_00000001,(float)(double)local_298,precision);
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_200);
      if (local_200 != (undefined1  [8])local_1f0) {
        operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
      }
      bVar1 = false;
    }
    tcu::TestLog::endSection(local_230.m_log);
    if (!bVar1) {
      return STOP;
    }
    break;
  case STATE_SAMPLE:
    uVar13 = (long)(this->m_unbatchedSamplesUs).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_unbatchedSamplesUs).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if ((int)uVar13 < this->m_unbatchedSampleCount) {
      uVar2 = (long)(this->m_batchedSamplesUs).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_batchedSamplesUs).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
      uVar15 = (long)uVar2 >> 3;
      iVar8 = this->m_batchedSampleCount;
      if (((int)uVar15 < iVar8) &&
         (auVar17._0_8_ =
               ((double)(uVar13 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(uVar13 & 0xffffffff | 0x4330000000000000),
         auVar17._8_8_ =
              ((double)(uVar15 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
              (double)(uVar15 & 0xffffffff | 0x4330000000000000),
         auVar18._0_8_ = (double)this->m_unbatchedSampleCount, auVar18._8_8_ = (double)iVar8,
         auVar18 = divpd(auVar17,auVar18), auVar18._8_8_ <= auVar18._0_8_)) goto LAB_0100d46a;
      local_200 = (undefined1  [8])renderUnbatched(this);
      __position._M_current =
           (this->m_unbatchedSamplesUs).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (this->m_unbatchedSamplesUs).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = (unsigned_long)local_200;
        (this->m_unbatchedSamplesUs).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
        return CONTINUE;
      }
      this_01 = &this->m_unbatchedSamplesUs;
    }
    else {
      iVar8 = this->m_batchedSampleCount;
      uVar2 = (long)(this->m_batchedSamplesUs).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_batchedSamplesUs).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
LAB_0100d46a:
      if (iVar8 <= (int)(uVar2 >> 3)) {
        this->m_state = STATE_CALC_CALIBRATION;
        return CONTINUE;
      }
      local_200 = (undefined1  [8])renderBatched(this);
      __position._M_current =
           (this->m_batchedSamplesUs).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (this->m_batchedSamplesUs).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = (unsigned_long)local_200;
        (this->m_batchedSamplesUs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        return CONTINUE;
      }
      this_01 = &this->m_batchedSamplesUs;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (this_01,__position,(unsigned_long *)local_200);
  }
  return CONTINUE;
}

Assistant:

tcu::TestCase::IterateResult DrawCallBatchingTest::iterate (void)
{
	if (m_state == STATE_LOG_INFO)
	{
		logTestInfo();
		m_state = STATE_WARMUP_BATCHED;
	}
	else if (m_state == STATE_WARMUP_BATCHED)
	{
		renderBatched();
		m_state = STATE_WARMUP_UNBATCHED;
	}
	else if (m_state == STATE_WARMUP_UNBATCHED)
	{
		renderUnbatched();
		m_state = STATE_SAMPLE;
	}
	else if (m_state == STATE_SAMPLE)
	{
		if ((int)m_unbatchedSamplesUs.size() < m_unbatchedSampleCount && ((double)m_unbatchedSamplesUs.size() / ((double)m_unbatchedSampleCount) < (double)m_batchedSamplesUs.size() / ((double)m_batchedSampleCount) || (int)m_batchedSamplesUs.size() >= m_batchedSampleCount))
			m_unbatchedSamplesUs.push_back(renderUnbatched());
		else if ((int)m_batchedSamplesUs.size() < m_batchedSampleCount)
			m_batchedSamplesUs.push_back(renderBatched());
		else
			m_state = STATE_CALC_CALIBRATION;
	}
	else if (m_state == STATE_CALC_CALIBRATION)
	{
		TestLog& log = m_testCtx.getLog();

		tcu::ScopedLogSection	section(log, ("Sampling iteration " + de::toString(m_sampleIteration)).c_str(), ("Sampling iteration " + de::toString(m_sampleIteration)).c_str());
		const double targetSEM	= 0.02;
		const double limitSEM	= 0.025;

		Statistics unbatchedStats	= calculateStats(m_unbatchedSamplesUs);
		Statistics batchedStats		= calculateStats(m_batchedSamplesUs);

		log << TestLog::Message << "Batched samples; Count: " << m_batchedSamplesUs.size() << ", Mean: " << batchedStats.mean << "us, Standard deviation: " << batchedStats.standardDeviation << "us, Standard error of mean: " << batchedStats.standardErrorOfMean << "us(" << (batchedStats.standardErrorOfMean/batchedStats.mean) << ")" << TestLog::EndMessage;
		log << TestLog::Message << "Unbatched samples; Count: " << m_unbatchedSamplesUs.size() << ", Mean: " << unbatchedStats.mean << "us, Standard deviation: " << unbatchedStats.standardDeviation << "us, Standard error of mean: " << unbatchedStats.standardErrorOfMean << "us(" << (unbatchedStats.standardErrorOfMean/unbatchedStats.mean) << ")" << TestLog::EndMessage;

		if (m_sampleIteration > 2 || (m_sampleIteration > 0 && (unbatchedStats.standardErrorOfMean/unbatchedStats.mean) + (batchedStats.standardErrorOfMean/batchedStats.mean) <= 2.0 * limitSEM))
		{
			if (m_sampleIteration > 2)
				log << TestLog::Message << "Maximum iteration count reached." << TestLog::EndMessage;

			log << TestLog::Message << "Standard errors in target range." << TestLog::EndMessage;
			log << TestLog::Message << "Batched/Unbatched ratio: " << (batchedStats.mean / unbatchedStats.mean) << TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)(batchedStats.mean/unbatchedStats.mean), 1).c_str());
			return STOP;
		}
		else
		{
			if ((unbatchedStats.standardErrorOfMean/unbatchedStats.mean) > targetSEM)
				log << TestLog::Message << "Unbatched standard error of mean outside of range." << TestLog::EndMessage;

			if ((batchedStats.standardErrorOfMean/batchedStats.mean) > targetSEM)
				log << TestLog::Message << "Batched standard error of mean outside of range." << TestLog::EndMessage;

			if (unbatchedStats.standardDeviation > 0.0)
			{
				double x = (unbatchedStats.standardDeviation / unbatchedStats.mean) / targetSEM;
				m_unbatchedSampleCount = std::max((int)m_unbatchedSamplesUs.size(), (int)(x * x));
			}
			else
				m_unbatchedSampleCount = (int)m_unbatchedSamplesUs.size();

			if (batchedStats.standardDeviation > 0.0)
			{
				double x = (batchedStats.standardDeviation / batchedStats.mean) / targetSEM;
				m_batchedSampleCount = std::max((int)m_batchedSamplesUs.size(), (int)(x * x));
			}
			else
				m_batchedSampleCount = (int)m_batchedSamplesUs.size();

			m_batchedSamplesUs.clear();
			m_unbatchedSamplesUs.clear();

			m_sampleIteration++;
			m_state = STATE_SAMPLE;
		}
	}
	else
		DE_ASSERT(false);

	return CONTINUE;
}